

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *this,EvalContext *ctx)

{
  ApplyFunc *pAVar1;
  Expr<tcu::Vector<float,_4>_> *pEVar2;
  Expr<deqp::gls::BuiltinPrecisionTests::Void> *pEVar3;
  undefined1 local_171;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 local_150 [96];
  undefined1 local_f0 [96];
  undefined1 local_90 [96];
  
  pAVar1 = this->m_func;
  (*(((this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
      super_ExprPBase<tcu::Vector<float,_4>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_ptr)
    ->super_ExprBase)._vptr_ExprBase[4])(local_150);
  pEVar2 = (this->m_args).b.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
           super_ExprPBase<tcu::Vector<float,_4>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.
           m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_90,pEVar2,ctx);
  pEVar2 = (this->m_args).c.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
           super_ExprPBase<tcu::Vector<float,_4>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.
           m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[4])(local_f0,pEVar2,ctx);
  pEVar3 = (this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(pEVar3,ctx);
  local_170 = local_150;
  local_158 = &local_171;
  local_168 = local_90;
  local_160 = local_f0;
  (*(pAVar1->super_FuncBase)._vptr_FuncBase[8])(__return_storage_ptr__,pAVar1,ctx);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		return m_func.apply(ctx,
							m_args.a->evaluate(ctx), m_args.b->evaluate(ctx),
							m_args.c->evaluate(ctx), m_args.d->evaluate(ctx));
	}